

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::member_is_non_native_row_major_matrix
          (CompilerGLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  uint32_t id;
  TypedID *this_00;
  SPIRType *pSVar2;
  CompilerError *this_01;
  undefined1 local_178 [8];
  SPIRType mbr_type;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  mbr_type.member_name_cache._M_h._M_single_bucket._4_4_ = index;
  if ((((this->backend).native_row_major_matrix & 1U) != 0) && (bVar1 = is_legacy(this), !bVar1)) {
    return false;
  }
  mbr_type.member_name_cache._M_h._M_single_bucket._0_4_ =
       TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration
                    (&this->super_Compiler,
                     (TypeID)mbr_type.member_name_cache._M_h._M_single_bucket._0_4_,
                     mbr_type.member_name_cache._M_h._M_single_bucket._4_4_,DecorationRowMajor);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_00 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                        (&(type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                         (ulong)mbr_type.member_name_cache._M_h._M_single_bucket._4_4_);
    id = TypedID::operator_cast_to_unsigned_int(this_00);
    pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
    SPIRType::SPIRType((SPIRType *)local_178,pSVar2);
    if (mbr_type.width != mbr_type.basetype) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_01,"Row-major matrices must be square on this platform.");
      __cxa_throw(this_01,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this_local._7_1_ = true;
    SPIRType::~SPIRType((SPIRType *)local_178);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::member_is_non_native_row_major_matrix(const SPIRType &type, uint32_t index)
{
	// Natively supported row-major matrices do not need to be converted.
	if (backend.native_row_major_matrix && !is_legacy())
		return false;

	// Non-matrix or column-major matrix types do not need to be converted.
	if (!has_member_decoration(type.self, index, DecorationRowMajor))
		return false;

	// Only square row-major matrices can be converted at this time.
	// Converting non-square matrices will require defining custom GLSL function that
	// swaps matrix elements while retaining the original dimensional form of the matrix.
	const auto mbr_type = get<SPIRType>(type.member_types[index]);
	if (mbr_type.columns != mbr_type.vecsize)
		SPIRV_CROSS_THROW("Row-major matrices must be square on this platform.");

	return true;
}